

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O2

void __thiscall RegexTree::firstpos(RegexTree *this,tree_node *ptr,StateSet *s)

{
  tree_node *ptr_00;
  char cVar1;
  bool bVar2;
  StateSet *extraout_RDX;
  StateSet *s_00;
  StateSet *extraout_RDX_00;
  value_type ptVar3;
  __ireturn_type _Var4;
  value_type local_20;
  
  if (this == (RegexTree *)0x0) {
    return;
  }
  cVar1 = *(char *)&this[2].root;
  if (cVar1 == '\a') {
    return;
  }
  local_20 = (value_type)this;
  if ((this->root == (tree_node *)0x0) && (this[1].root == (tree_node *)0x0)) {
    _Var4 = std::__detail::
            _Insert_base<const_tree_node_*,_const_tree_node_*,_std::allocator<const_tree_node_*>,_std::__detail::_Identity,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::insert((_Insert_base<const_tree_node_*,_const_tree_node_*,_std::allocator<const_tree_node_*>,_std::__detail::_Identity,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)ptr,&local_20);
    s = _Var4._8_8_;
    cVar1 = local_20->c;
  }
  if (cVar1 == '\b') {
    ptr_00 = local_20->left;
    bVar2 = nullable(ptr_00);
    firstpos((RegexTree *)ptr_00,ptr,s_00);
    s = extraout_RDX_00;
    if (!bVar2) {
      return;
    }
  }
  else {
    ptVar3 = local_20;
    if (cVar1 == '\t') goto LAB_001033c3;
    if (cVar1 != '\n') {
      return;
    }
    firstpos((RegexTree *)local_20->left,ptr,s);
    s = extraout_RDX;
  }
  ptVar3 = (value_type)&local_20->right;
LAB_001033c3:
  firstpos((RegexTree *)ptVar3->left,ptr,s);
  return;
}

Assistant:

void RegexTree::firstpos(const tree_node *ptr, RegexTree::StateSet &s) {
    if (ptr == nullptr || ptr->c == EPSILON) return;
    if (ptr->left == nullptr && ptr->right == nullptr)
        s.insert(ptr);
    if (ptr->c == OR) {
        firstpos(ptr->left, s);
        firstpos(ptr->right, s);
        return;
    }
    if (ptr->c == CAT) {
        if (nullable(ptr->left)) {
            firstpos(ptr->left, s);
            firstpos(ptr->right, s);
        } else
            firstpos(ptr->left, s);
        return;
    }
    if (ptr->c == STAR)
        firstpos(ptr->left, s);
}